

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.h
# Opt level: O2

void __thiscall Am_Double_Data::~Am_Double_Data(Am_Double_Data *this)

{
  operator_delete(this);
  return;
}

Assistant:

class _OA_DL_CLASSIMPORT Am_Double_Data : public Am_Wrapper
{
  AM_WRAPPER_DATA_DECL(Am_Double)
public:
  bool operator==(const Am_Double_Data &test_value) const;
  operator double() const;
  Am_Double_Data(double value);
  void Print(std::ostream &out) const override;

private:
  double value;
}